

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::StructConstructorParams
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,StructDef *struct_def,
          string *prefix)

{
  StructDef *struct_def_00;
  string *__lhs;
  bool bVar1;
  ulong uVar2;
  reference ppFVar3;
  ostream *poVar4;
  string local_2b0;
  string local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  FieldDef *local_1f0;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_1e0;
  iterator it;
  undefined1 local_1c8 [8];
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> field_vec;
  stringstream out;
  ostream local_1a0 [376];
  string *local_28;
  string *prefix_local;
  StructDef *struct_def_local;
  KotlinKMPGenerator *this_local;
  
  local_28 = prefix;
  prefix_local = (string *)struct_def;
  struct_def_local = (StructDef *)this;
  this_local = (KotlinKMPGenerator *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &field_vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_1c8,
             (vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
             ((long)&prefix_local[7].field_2 + 8));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::operator<<(local_1a0,"builder: FlatBufferBuilder");
  }
  local_1e0._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  local_1c8);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       local_1c8);
    bVar1 = __gnu_cxx::operator!=
                      (&local_1e0,
                       (__normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_1e0);
    local_1f0 = *ppFVar3;
    bVar1 = IsStruct(&(local_1f0->value).type);
    __lhs = local_28;
    if (bVar1) {
      struct_def_00 = (local_1f0->value).type.struct_def;
      IdlNamer::Variable_abi_cxx11_(&local_270,&this->namer_,local_1f0);
      std::operator+(&local_250,&local_270,"_");
      std::operator+(&local_230,__lhs,&local_250);
      StructConstructorParams(&local_210,this,struct_def_00,&local_230);
      std::operator<<(local_1a0,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
    }
    else {
      poVar4 = std::operator<<(local_1a0,", ");
      poVar4 = std::operator<<(poVar4,(string *)local_28);
      IdlNamer::Variable_abi_cxx11_(&local_290,&this->namer_,local_1f0);
      poVar4 = std::operator<<(poVar4,(string *)&local_290);
      poVar4 = std::operator<<(poVar4,": ");
      GenType_abi_cxx11_(&local_2b0,this,&(local_1f0->value).type);
      std::operator<<(poVar4,(string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_290);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_1e0);
  }
  std::__cxx11::stringstream::str();
  std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::~vector
            ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)local_1c8)
  ;
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)
             &field_vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::string StructConstructorParams(const StructDef &struct_def,
                                      const std::string &prefix = "") const {
    // builder: FlatBufferBuilder
    std::stringstream out;
    auto field_vec = struct_def.fields.vec;
    if (prefix.empty()) { out << "builder: FlatBufferBuilder"; }
    for (auto it = field_vec.begin(); it != field_vec.end(); ++it) {
      auto &field = **it;
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure
        // names don't clash, and to make it obvious these arguments are
        // constructing a nested struct, prefix the name with the field
        // name.
        out << StructConstructorParams(*field.value.type.struct_def,
                                       prefix + (namer_.Variable(field) + "_"));
      } else {
        out << ", " << prefix << namer_.Variable(field) << ": "
            << GenType(field.value.type);
      }
    }
    return out.str();
  }